

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O1

void __thiscall duckdb_shell::ShellState::NewTempFile(ShellState *this,char *zSuffix)

{
  char **ptr;
  char *pcVar1;
  char *pcVar2;
  sqlite3_uint64 r;
  undefined8 local_20;
  
  ClearTempFile(this);
  ptr = &this->zTempFile;
  duckdb_shell_sqlite3_free(this->zTempFile);
  this->zTempFile = (char *)0x0;
  if (this->db != (sqlite3 *)0x0) {
    duckdb_shell_sqlite3_file_control(this->db,(char *)0x0,0x10,ptr);
  }
  pcVar2 = *ptr;
  if (pcVar2 == (char *)0x0) {
    duckdb_shell_sqlite3_randomness(8,&local_20);
    pcVar1 = getenv("TEMP");
    if (pcVar1 == (char *)0x0) {
      pcVar1 = getenv("TMP");
    }
    pcVar2 = "/tmp";
    if (pcVar1 != (char *)0x0) {
      pcVar2 = pcVar1;
    }
    pcVar1 = duckdb_shell_sqlite3_mprintf("%s/temp%llx.%s",pcVar2,local_20,zSuffix);
  }
  else {
    pcVar1 = duckdb_shell_sqlite3_mprintf("%z.%s",pcVar2,zSuffix);
  }
  *ptr = pcVar1;
  if (*ptr != (char *)0x0) {
    return;
  }
  NewTempFile();
  bail_on_error = booleanValue(*(char **)(pcVar2 + 8));
  return;
}

Assistant:

void ShellState::NewTempFile(const char *zSuffix) {
	ClearTempFile();
	sqlite3_free(zTempFile);
	zTempFile = 0;
	if (db) {
		sqlite3_file_control(db, 0, SQLITE_FCNTL_TEMPFILENAME, &zTempFile);
	}
	if (zTempFile == 0) {
		/* If db is an in-memory database then the TEMPFILENAME file-control
		** will not work and we will need to fallback to guessing */
		const char *zTemp;
		sqlite3_uint64 r;
		sqlite3_randomness(sizeof(r), &r);
		zTemp = getenv("TEMP");
		if (zTemp == 0)
			zTemp = getenv("TMP");
		if (zTemp == 0) {
#ifdef _WIN32
			zTemp = "\\tmp";
#else
			zTemp = "/tmp";
#endif
		}
		zTempFile = sqlite3_mprintf("%s/temp%llx.%s", zTemp, r, zSuffix);
	} else {
		zTempFile = sqlite3_mprintf("%z.%s", zTempFile, zSuffix);
	}
	if (zTempFile == 0) {
		raw_printf(stderr, "out of memory\n");
		exit(1);
	}
}